

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

bool __thiscall
tetgenio::load_node_call(tetgenio *this,FILE *infile,int markers,int uvflag,char *infilename)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  double *pdVar6;
  int *piVar7;
  pointparam *ppVar8;
  long lVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  int local_878;
  int local_874;
  int j;
  int i;
  int attribindex;
  int index;
  int currentmarker;
  int firstnode;
  double attrib;
  double z;
  double y;
  double x;
  char *stringptr;
  char inputline [2048];
  char *infilename_local;
  int uvflag_local;
  int markers_local;
  FILE *infile_local;
  tetgenio *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(this->numberofpoints * 3);
  uVar5 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pdVar6 = (double *)operator_new__(uVar5);
  this->pointlist = pdVar6;
  if (this->pointlist == (double *)0x0) {
    terminatetetgen((tetgenmesh *)0x0,1);
  }
  if (0 < this->numberofpointattributes) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)(this->numberofpoints * this->numberofpointattributes);
    uVar5 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pdVar6 = (double *)operator_new__(uVar5);
    this->pointattributelist = pdVar6;
    if (this->pointattributelist == (double *)0x0) {
      terminatetetgen((tetgenmesh *)0x0,1);
    }
  }
  if (markers != 0) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)this->numberofpoints;
    uVar5 = SUB168(auVar3 * ZEXT816(4),0);
    if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    piVar7 = (int *)operator_new__(uVar5);
    this->pointmarkerlist = piVar7;
    if (this->pointmarkerlist == (int *)0x0) {
      terminatetetgen((tetgenmesh *)0x0,1);
    }
  }
  if (uvflag != 0) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)this->numberofpoints;
    uVar5 = SUB168(auVar4 * ZEXT816(0x18),0);
    if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    ppVar8 = (pointparam *)operator_new__(uVar5);
    this->pointparamlist = ppVar8;
    if (this->pointparamlist == (pointparam *)0x0) {
      terminatetetgen((tetgenmesh *)0x0,1);
    }
  }
  i = 0;
  j = 0;
  local_874 = 0;
  do {
    if (this->numberofpoints <= local_874) {
LAB_001144dd:
      if (local_874 < this->numberofpoints) {
        if (this->pointlist != (double *)0x0) {
          operator_delete__(this->pointlist);
        }
        this->pointlist = (double *)0x0;
        if (markers != 0) {
          if (this->pointmarkerlist != (int *)0x0) {
            operator_delete__(this->pointmarkerlist);
          }
          this->pointmarkerlist = (int *)0x0;
        }
        if (0 < this->numberofpointattributes) {
          if (this->pointattributelist != (double *)0x0) {
            operator_delete__(this->pointattributelist);
          }
          this->pointattributelist = (double *)0x0;
        }
        if (uvflag != 0) {
          if (this->pointparamlist != (pointparam *)0x0) {
            operator_delete__(this->pointparamlist);
          }
          this->pointparamlist = (pointparam *)0x0;
        }
        this->numberofpoints = 0;
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
      return this_local._7_1_;
    }
    x = (double)readnumberline(this,(char *)&stringptr,infile,infilename);
    if (this->useindex != 0) {
      if (local_874 == 0) {
        lVar9 = strtol((char *)x,(char **)&x,0);
        iVar10 = (int)lVar9;
        if ((iVar10 == 0) || (iVar10 == 1)) {
          this->firstnumber = iVar10;
        }
      }
      x = (double)findnextnumber(this,(char *)x);
    }
    if (*(char *)x == '\0') {
      printf("Error:  Point %d has no x coordinate.\n",(ulong)(uint)(this->firstnumber + local_874))
      ;
      goto LAB_001144dd;
    }
    dVar11 = strtod((char *)x,(char **)&x);
    x = (double)findnextnumber(this,(char *)x);
    if (*(char *)x == '\0') {
      printf("Error:  Point %d has no y coordinate.\n",(ulong)(uint)(this->firstnumber + local_874))
      ;
      goto LAB_001144dd;
    }
    dVar12 = strtod((char *)x,(char **)&x);
    if (this->mesh_dim == 3) {
      x = (double)findnextnumber(this,(char *)x);
      if (*(char *)x == '\0') {
        printf("Error:  Point %d has no z coordinate.\n",
               (ulong)(uint)(this->firstnumber + local_874));
        goto LAB_001144dd;
      }
      attrib = strtod((char *)x,(char **)&x);
    }
    else {
      attrib = 0.0;
    }
    this->pointlist[i] = dVar11;
    iVar10 = i + 2;
    this->pointlist[i + 1] = dVar12;
    i = i + 3;
    this->pointlist[iVar10] = attrib;
    for (local_878 = 0; local_878 < this->numberofpointattributes; local_878 = local_878 + 1) {
      x = (double)findnextnumber(this,(char *)x);
      if (*(char *)x == '\0') {
        _currentmarker = 0.0;
      }
      else {
        _currentmarker = strtod((char *)x,(char **)&x);
      }
      this->pointattributelist[j] = _currentmarker;
      j = j + 1;
    }
    if (markers != 0) {
      x = (double)findnextnumber(this,(char *)x);
      if (*(char *)x == '\0') {
        attribindex = 0;
      }
      else {
        lVar9 = strtol((char *)x,(char **)&x,0);
        attribindex = (int)lVar9;
      }
      this->pointmarkerlist[local_874] = attribindex;
    }
    if (uvflag != 0) {
      x = (double)findnextnumber(this,(char *)x);
      if (*(char *)x == '\0') {
        printf("Error:  Point %d has no uv[0].\n",(ulong)(uint)(this->firstnumber + local_874));
        goto LAB_001144dd;
      }
      dVar11 = strtod((char *)x,(char **)&x);
      this->pointparamlist[local_874].uv[0] = dVar11;
      x = (double)findnextnumber(this,(char *)x);
      if (*(char *)x == '\0') {
        printf("Error:  Point %d has no uv[1].\n",(ulong)(uint)(this->firstnumber + local_874));
        goto LAB_001144dd;
      }
      dVar11 = strtod((char *)x,(char **)&x);
      this->pointparamlist[local_874].uv[1] = dVar11;
      x = (double)findnextnumber(this,(char *)x);
      if (*(char *)x == '\0') {
        printf("Error:  Point %d has no tag.\n",(ulong)(uint)(this->firstnumber + local_874));
        goto LAB_001144dd;
      }
      lVar9 = strtol((char *)x,(char **)&x,0);
      this->pointparamlist[local_874].tag = (int)lVar9;
      x = (double)findnextnumber(this,(char *)x);
      if (*(char *)x == '\0') {
        printf("Error:  Point %d has no type.\n",(ulong)(uint)(this->firstnumber + local_874));
        goto LAB_001144dd;
      }
      lVar9 = strtol((char *)x,(char **)&x,0);
      this->pointparamlist[local_874].type = (int)lVar9;
      if ((this->pointparamlist[local_874].type < 0) || (2 < this->pointparamlist[local_874].type))
      {
        printf("Error:  Point %d has an invalid type.\n",
               (ulong)(uint)(this->firstnumber + local_874));
        goto LAB_001144dd;
      }
    }
    local_874 = local_874 + 1;
  } while( true );
}

Assistant:

bool tetgenio::load_node_call(FILE* infile, int markers, int uvflag, 
                              char* infilename)
{
  char inputline[INPUTLINESIZE];
  char *stringptr;
  REAL x, y, z, attrib;
  int firstnode, currentmarker;
  int index, attribindex;
  int i, j;

  // Initialize 'pointlist', 'pointattributelist', and 'pointmarkerlist'.
  pointlist = new REAL[numberofpoints * 3];
  if (pointlist == (REAL *) NULL) {
    terminatetetgen(NULL, 1);
  }
  if (numberofpointattributes > 0) {
    pointattributelist = new REAL[numberofpoints * numberofpointattributes];
    if (pointattributelist == (REAL *) NULL) {
      terminatetetgen(NULL, 1);
    }
  }
  if (markers) {
    pointmarkerlist = new int[numberofpoints];
    if (pointmarkerlist == (int *) NULL) {
      terminatetetgen(NULL, 1);
    }
  }
  if (uvflag) {
    pointparamlist = new pointparam[numberofpoints];
    if (pointparamlist == NULL) {
      terminatetetgen(NULL, 1);
    }
  }

  // Read the point section.
  index = 0;
  attribindex = 0;
  for (i = 0; i < numberofpoints; i++) {
    stringptr = readnumberline(inputline, infile, infilename);
    if (useindex) {
      if (i == 0) {
        firstnode = (int) strtol (stringptr, &stringptr, 0);
        if ((firstnode == 0) || (firstnode == 1)) {
          firstnumber = firstnode;
        }
      }
      stringptr = findnextnumber(stringptr);
    } // if (useindex)
    if (*stringptr == '\0') {
      printf("Error:  Point %d has no x coordinate.\n", firstnumber + i);
      break;
    }
    x = (REAL) strtod(stringptr, &stringptr);
    stringptr = findnextnumber(stringptr);
    if (*stringptr == '\0') {
      printf("Error:  Point %d has no y coordinate.\n", firstnumber + i);
      break;
    }
    y = (REAL) strtod(stringptr, &stringptr);
    if (mesh_dim == 3) {
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  Point %d has no z coordinate.\n", firstnumber + i);
        break;
      }
      z = (REAL) strtod(stringptr, &stringptr);
    } else {
      z = 0.0; // mesh_dim == 2;
    }
    pointlist[index++] = x;
    pointlist[index++] = y;
    pointlist[index++] = z;
    // Read the point attributes.
    for (j = 0; j < numberofpointattributes; j++) {
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        attrib = 0.0;
      } else {
        attrib = (REAL) strtod(stringptr, &stringptr);
      }
      pointattributelist[attribindex++] = attrib;
    }
    if (markers) {
      // Read a point marker.
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        currentmarker = 0;
      } else {
        currentmarker = (int) strtol (stringptr, &stringptr, 0);
      }
      pointmarkerlist[i] = currentmarker;
    }
    if (uvflag) {
      // Read point paramteters.
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  Point %d has no uv[0].\n", firstnumber + i);
        break;
      }
      pointparamlist[i].uv[0] = (REAL) strtod(stringptr, &stringptr);
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  Point %d has no uv[1].\n", firstnumber + i);
        break;
      }
      pointparamlist[i].uv[1] = (REAL) strtod(stringptr, &stringptr);
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  Point %d has no tag.\n", firstnumber + i);
        break;
      }
      pointparamlist[i].tag = (int) strtol (stringptr, &stringptr, 0);
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  Point %d has no type.\n", firstnumber + i);
        break;
      }
      pointparamlist[i].type = (int) strtol (stringptr, &stringptr, 0);
      if ((pointparamlist[i].type < 0) || (pointparamlist[i].type > 2)) {
        printf("Error:  Point %d has an invalid type.\n", firstnumber + i);
        break;
      }
    }
  }
  if (i < numberofpoints) {
    // Failed to read points due to some error.
    delete [] pointlist;
    pointlist = (REAL *) NULL;
    if (markers) {
      delete [] pointmarkerlist;
      pointmarkerlist = (int *) NULL;
    }
    if (numberofpointattributes > 0) {
      delete [] pointattributelist;
      pointattributelist = (REAL *) NULL;
    }
    if (uvflag) {
      delete [] pointparamlist;
      pointparamlist = NULL;
    }
    numberofpoints = 0;
    return false;
  }
  return true;
}